

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void __thiscall MdlOptions::MdlOptions(MdlOptions *this,int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  basic_command_line_parser<char> *pbVar4;
  size_type sVar5;
  ostream *poVar6;
  variable_value *pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  bool bVar9;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  key_type local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  key_type local_408;
  allocator<char> local_3e1;
  string local_3e0;
  byte local_3bb;
  byte local_3ba;
  allocator<char> local_3b9;
  key_type local_3b8;
  allocator<char> local_391;
  key_type local_390;
  allocator<char> local_369;
  key_type local_368;
  clone_impl<boost::exception_detail::error_info_injector<boost::program_options::unknown_option>_>
  e;
  basic_parsed_options<char> local_1e8;
  variables_map local_1c0 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1b0 [144];
  positional_options_description local_120 [8];
  positional_options_description p;
  undefined8 local_e8;
  options_description local_e0 [8];
  options_description desc;
  allocator<char> local_59;
  string local_58 [8];
  string usage;
  allocator<char> local_21;
  char **local_20;
  char **argv_local;
  MdlOptions *pMStack_10;
  int argc_local;
  MdlOptions *this_local;
  
  this->_standalone = true;
  local_20 = argv;
  argv_local._4_4_ = argc;
  pMStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_display_driver,"ncurses",&local_21);
  std::allocator<char>::~allocator(&local_21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_input_file,"",(allocator<char> *)(usage.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(usage.field_2._M_local_buf + 0xb));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_output_file,"",(allocator<char> *)(usage.field_2._M_local_buf + 10));
  std::allocator<char>::~allocator((allocator<char> *)(usage.field_2._M_local_buf + 10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"Usage: mdl [OPTIONS] <input-file>",&local_59);
  std::allocator<char>::~allocator(&local_59);
  boost::program_options::options_description::options_description
            (local_e0,local_58,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  local_e8 = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_e8,"help,h");
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"display-driver,d",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"input-parser,p",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"input-file,i",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"output-file,o",(char *)ptVar3);
  boost::program_options::options_description_easy_init::operator()(pcVar2,"version");
  boost::program_options::positional_options_description::positional_options_description(local_120);
  boost::program_options::positional_options_description::add((char *)local_120,0x19718f);
  boost::program_options::variables_map::variables_map(local_1c0);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&e.field_0xe0,argv_local._4_4_,local_20);
  pbVar4 = boost::program_options::basic_command_line_parser<char>::options
                     ((basic_command_line_parser<char> *)&e.field_0xe0,local_e0);
  pbVar4 = boost::program_options::basic_command_line_parser<char>::positional(pbVar4,local_120);
  boost::program_options::basic_command_line_parser<char>::run(&local_1e8,pbVar4);
  boost::program_options::store((basic_parsed_options *)&local_1e8,local_1c0,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1e8);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)&e.field_0xe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"help",&local_369);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_1b0,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  if (sVar5 != 0) {
    boost::program_options::operator<<((ostream *)&std::cout,local_e0);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"version",&local_391);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_1b0,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  if (sVar5 == 0) {
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::empty(local_1b0);
    local_3ba = 0;
    local_3bb = 0;
    bVar9 = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_3ba = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,"input-file",&local_3b9);
      local_3bb = 1;
      sVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(local_1b0,&local_3b8);
      bVar9 = sVar5 == 0;
    }
    if ((local_3bb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3b8);
    }
    if ((local_3ba & 1) != 0) {
      std::allocator<char>::~allocator(&local_3b9);
    }
    if (bVar9) {
      poVar6 = std::operator<<((ostream *)&std::cout,local_58);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"mdl: Missing an input file");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"input-file",&local_3e1)
    ;
    pvVar7 = boost::program_options::variables_map::operator[](local_1c0,&local_3e0);
    pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar7);
    std::__cxx11::string::operator=((string *)&this->_input_file,(string *)pbVar8);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"display-driver",&local_409);
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_1b0,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    if (sVar5 == 0) {
      std::__cxx11::string::operator=((string *)&this->_display_driver,"ncurses");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"display-driver",&local_431);
      pvVar7 = boost::program_options::variables_map::operator[](local_1c0,&local_430);
      pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar7);
      std::__cxx11::string::operator=((string *)&this->_display_driver,(string *)pbVar8);
      std::__cxx11::string::~string((string *)&local_430);
      std::allocator<char>::~allocator(&local_431);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"output-file",&local_459);
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_1b0,&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator(&local_459);
    if (sVar5 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_480,"output-file",&local_481);
      pvVar7 = boost::program_options::variables_map::operator[](local_1c0,&local_480);
      pbVar8 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar7);
      std::__cxx11::string::operator=((string *)&this->_output_file,(string *)pbVar8);
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator(&local_481);
    }
    boost::program_options::variables_map::~variables_map(local_1c0);
    boost::program_options::positional_options_description::~positional_options_description
              (local_120);
    boost::program_options::options_description::~options_description(local_e0);
    std::__cxx11::string::~string(local_58);
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"mdl (version: ");
  poVar6 = std::operator<<(poVar6,"1.1.3");
  poVar6 = std::operator<<(poVar6,")");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

MdlOptions::MdlOptions(int argc, const char *const *argv) :
	_standalone(true),
	_display_driver("ncurses"),
	_input_file(""),
	_output_file("") {
	// Set Boost program options up
	const string usage("Usage: mdl [OPTIONS] <input-file>");
	po::options_description desc(usage);
	desc.add_options()
		("help,h", "produce help message and exit")
		("display-driver,d", po::value<string>(), "set display driver")
		("input-parser,p", po::value<string>(), "set input parser")
		("input-file,i", po::value<string>(), "input file to be used")
		("output-file,o", po::value<string>(), "output file")
		("version", "print the version information and exit");
	po::positional_options_description p;
	p.add("input-file", -1);
	po::variables_map vm;
	
	try {
		po::store(po::command_line_parser(argc, argv).options(desc).positional(p).run(), vm);
	} catch (boost::exception_detail::clone_impl<boost::exception_detail::error_info_injector<boost::program_options::unknown_option> > e) {
		cerr << "mdl: " << e.what() << endl;
		exit(1);
	}
	
	if (vm.count("help")) {
		cout << desc;
		exit(0);
	} else if (vm.count("version")) {
		cout << "mdl (version: " << MDL_VERSION_STRING << ")" << endl;
		exit(0);
	} else if (vm.empty() or vm.count("input-file") == 0) {
		cout << usage << endl;
		cout << "mdl: Missing an input file" << endl;
		exit(0);
	}

	_input_file = vm["input-file"].as<string>();
	
	if (vm.count("display-driver")) {
		_display_driver = vm["display-driver"].as<string>();
	} else {
		_display_driver = "ncurses";
	}

	if (vm.count("output-file")) {
		_output_file = vm["output-file"].as<string>();
	}
}